

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufref.c
# Opt level: O3

void Curl_bufref_set(bufref *br,void *ptr,size_t len,_func_void_void_ptr *dtor)

{
  if ((br->ptr != (uchar *)0x0) && (br->dtor != (_func_void_void_ptr *)0x0)) {
    (*br->dtor)(br->ptr);
  }
  br->ptr = (uchar *)ptr;
  br->len = len;
  br->dtor = dtor;
  return;
}

Assistant:

void Curl_bufref_set(struct bufref *br, const void *ptr, size_t len,
                     void (*dtor)(void *))
{
  DEBUGASSERT(ptr || !len);
  DEBUGASSERT(len <= CURL_MAX_INPUT_LENGTH);

  Curl_bufref_free(br);
  br->ptr = (const unsigned char *) ptr;
  br->len = len;
  br->dtor = dtor;
}